

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats_recorder.cpp
# Opt level: O2

int __thiscall RunStatsRecorder::append_to(RunStatsRecorder *this,CSVStringTable *st)

{
  uint row;
  uint uVar1;
  
  row = CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        addRows(st,1);
  uVar1 = update_row(this,st,row);
  if (uVar1 == 0) {
    uVar1 = row;
  }
  return uVar1;
}

Assistant:

int RunStatsRecorder::append_to(CSVStringTable& st) const{
  int ret;
  unsigned new_row = st.addRows(1);

  if ((ret = update_row(st, new_row)))
    return ret;
  else
    return new_row;
}